

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O2

Span * __thiscall tcmalloc::PageHeap::SearchSmallAndLarge(PageHeap *this,uint64_t n)

{
  bool bVar1;
  ulong uVar2;
  Span *pSVar3;
  Span *pSVar4;
  
  uVar2 = n - 1;
  pSVar3 = this->small_returned_ + (n - 1);
  while( true ) {
    pSVar4 = pSVar3;
    uVar2 = uVar2 + 1;
    if (0x7f < uVar2) {
      pSVar3 = AllocLarge(this,n);
      return pSVar3;
    }
    if (pSVar4 + -0x7f != pSVar4[-0x7f].prev) break;
    pSVar3 = pSVar4 + 1;
    if (pSVar4 + 1 != pSVar4[1].prev) {
      pSVar3 = pSVar4[1].next;
      RemoveFromFreeList(this,pSVar3);
      bVar1 = CheckSmallList(this);
      if (bVar1) {
        return pSVar3;
      }
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0xae,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
    }
  }
  pSVar3 = pSVar4[-0x7f].next;
  RemoveFromFreeList(this,pSVar3);
  bVar1 = CheckSmallList(this);
  if (bVar1) {
    return pSVar3;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0xa7,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
}

Assistant:

Span* SearchSmallAndLarge(uint64_t n) {
        Span* span = nullptr;
        for (uint64_t i = n; i <= spanSmallPages; ++i) {
            if (!ListEmpty(&small_normal_[i])) {
                span = small_normal_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }

            if (!ListEmpty(&small_returned_[i])) {
                span = small_returned_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }
        }
        return AllocLarge(n);
    }